

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<14>::
AngularDistributions<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>::AngularDistributions
          (AngularDistributions<njoy::ENDFtk::section::Type<14>::LegendreCoefficients> *this,
          vector<long,_std::allocator<long>_> *boundaries,
          vector<long,_std::allocator<long>_> *interpolants,
          vector<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
          *distributions,double C1,double C2)

{
  InterpolationBase IStack_78;
  
  InterpolationRecord::InterpolationRecord
            ((InterpolationRecord *)&IStack_78,C1,C2,0,0,interpolants,boundaries);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>::
  InterpolationSequenceRecord
            (&this->
              super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>
             ,(InterpolationRecord *)&IStack_78,distributions);
  record::InterpolationBase::~InterpolationBase(&IStack_78);
  return;
}

Assistant:

AngularDistributions( std::vector< long >&& boundaries,
                      std::vector< long >&& interpolants,
                      std::vector< Records >&& distributions,
                      double C1 = 0.0, double C2 = 0.0 ) :
  InterpolationSequenceRecord< Records >(
    InterpolationRecord( C1, C2, 0, 0,
                         std::move( interpolants ), std::move( boundaries ) ),
    std::move( distributions ) ) {}